

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  char *pcVar1;
  ostream *poVar2;
  Colour *in_RDI;
  Colour colourGuard;
  size_t in_stack_00000040;
  string *in_stack_00000048;
  ConsoleReporter *in_stack_00000050;
  ostream *poVar3;
  Code _colourCode;
  
  poVar3 = *(ostream **)(in_RDI + 0x18);
  pcVar1 = getLineOfChars<(char)45>();
  poVar2 = std::operator<<(poVar3,pcVar1);
  _colourCode = (Code)((ulong)poVar3 >> 0x20);
  std::operator<<(poVar2,'\n');
  Colour::Colour(in_RDI,_colourCode);
  printHeaderString(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  Colour::~Colour((Colour *)0x24b93c);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}